

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O0

optional<pbrt::SquareMatrix<4>_> * pbrt::Inverse<4>(SquareMatrix<4> *m)

{
  float fVar1;
  float terms_3;
  optional<pbrt::SquareMatrix<4>_> *in_RDI;
  float fVar2;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  eVar3;
  Float inv [4] [4];
  Float s;
  Float determinant;
  Float c5;
  Float c4;
  Float c3;
  Float c2;
  Float c1;
  Float c0;
  Float s5;
  Float s4;
  Float s3;
  Float s2;
  Float s1;
  Float s0;
  float fVar4;
  int in_stack_fffffffffffff70c;
  undefined4 in_stack_fffffffffffff710;
  float terms_5;
  float in_stack_fffffffffffff714;
  float in_stack_fffffffffffff718;
  float in_stack_fffffffffffff71c;
  float in_stack_fffffffffffff720;
  float terms_1;
  float in_stack_fffffffffffff724;
  float in_stack_fffffffffffff728;
  float in_stack_fffffffffffff72c;
  float in_stack_fffffffffffff730;
  float in_stack_fffffffffffff734;
  float in_stack_fffffffffffff738;
  float in_stack_fffffffffffff73c;
  float in_stack_fffffffffffff740;
  float in_stack_fffffffffffff744;
  float in_stack_fffffffffffff750;
  float in_stack_fffffffffffff758;
  float in_stack_fffffffffffff760;
  float in_stack_fffffffffffff768;
  SquareMatrix<4> local_6f8;
  span<const_float> local_6b8;
  span<const_float> local_6a8;
  span<const_float> local_698;
  span<const_float> local_688;
  span<const_float> local_678;
  span<const_float> local_668;
  span<const_float> local_658;
  span<const_float> local_648;
  span<const_float> local_638;
  span<const_float> local_628;
  span<const_float> local_618;
  span<const_float> local_608;
  span<const_float> local_5f8;
  span<const_float> local_5e8;
  span<const_float> local_5d8;
  span<const_float> local_5c8;
  span<const_float> local_5b8;
  span<const_float> local_5a8;
  span<const_float> local_598;
  span<const_float> local_588;
  span<const_float> local_578;
  span<const_float> local_568;
  span<const_float> local_558;
  span<const_float> local_548;
  span<const_float> local_538;
  span<const_float> local_528;
  span<const_float> local_518;
  span<const_float> local_508;
  span<const_float> local_4f8;
  span<const_float> local_4e8;
  span<const_float> local_4d8;
  span<const_float> local_4c8;
  span<const_float> local_4b8;
  span<const_float> local_4a8;
  span<const_float> local_498;
  span<const_float> local_488;
  span<const_float> local_478;
  span<const_float> local_468;
  span<const_float> local_458;
  span<const_float> local_448;
  span<const_float> local_438;
  span<const_float> local_428;
  span<const_float> local_418;
  span<const_float> local_408;
  span<const_float> local_3f8;
  span<const_float> local_3e8;
  span<const_float> local_3d8;
  span<const_float> local_3c8;
  float local_3b8;
  float local_3b4;
  float local_3b0;
  float local_3ac;
  float local_3a8;
  float local_3a4;
  float local_3a0;
  float local_39c;
  float local_398;
  float local_394;
  float local_390;
  float local_38c;
  float local_388;
  float local_384;
  float local_380;
  float local_37c;
  float local_378;
  enable_if_t<std::conjunction_v<std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>,_std::is_arithmetic<float>_>,_Float>
  local_374;
  span<const_float> local_370;
  span<const_float> local_360;
  span<const_float> local_350;
  span<const_float> local_340;
  float local_32c;
  span<const_float> local_328;
  span<const_float> local_318;
  span<const_float> local_308;
  span<const_float> local_2f8;
  float local_2e4;
  span<const_float> local_2e0;
  span<const_float> local_2d0;
  span<const_float> local_2c0;
  span<const_float> local_2b0;
  float local_29c;
  span<const_float> local_298;
  span<const_float> local_288;
  span<const_float> local_278;
  span<const_float> local_268;
  float local_254;
  span<const_float> local_250;
  span<const_float> local_240;
  span<const_float> local_230;
  span<const_float> local_220;
  float local_20c;
  span<const_float> local_208;
  span<const_float> local_1f8;
  span<const_float> local_1e8;
  span<const_float> local_1d8;
  float local_1c4;
  span<const_float> local_1c0;
  span<const_float> local_1b0;
  span<const_float> local_1a0;
  span<const_float> local_190;
  float local_17c;
  span<const_float> local_178;
  span<const_float> local_168;
  span<const_float> local_158;
  span<const_float> local_148;
  float local_134;
  span<const_float> local_130;
  span<const_float> local_120;
  span<const_float> local_110;
  span<const_float> local_100;
  float local_ec;
  span<const_float> local_e8;
  span<const_float> local_d8;
  span<const_float> local_c8;
  span<const_float> local_b8;
  float local_a4;
  span<const_float> local_a0;
  span<const_float> local_90;
  span<const_float> local_80;
  span<const_float> local_70;
  float local_5c;
  span<const_float> local_58;
  span<const_float> local_48;
  span<const_float> local_38;
  span<const_float> local_28;
  float local_14;
  
  local_28 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_28,0);
  local_38 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_38,1);
  local_48 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_48,0);
  local_58 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_58,1);
  local_14 = DifferenceOfProducts<float,float,float,float>
                       (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                        in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_70 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_70,0);
  local_80 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_80,2);
  local_90 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_90,0);
  local_a0 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_a0,2);
  local_5c = DifferenceOfProducts<float,float,float,float>
                       (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                        in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_b8 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_b8,0);
  local_c8 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_c8,3);
  local_d8 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_d8,0);
  local_e8 = SquareMatrix<4>::operator[]
                       ((SquareMatrix<4> *)
                        CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                        in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_e8,3);
  local_a4 = DifferenceOfProducts<float,float,float,float>
                       (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                        in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_100 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_100,1);
  local_110 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_110,2);
  local_120 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_120,1);
  local_130 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_130,2);
  local_ec = DifferenceOfProducts<float,float,float,float>
                       (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                        in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_148 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_148,1);
  local_158 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_158,3);
  local_168 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_168,1);
  local_178 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_178,3);
  local_134 = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_190 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_190,2);
  local_1a0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_1a0,3);
  local_1b0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_1b0,2);
  local_1c0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_1c0,3);
  local_17c = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_1d8 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_1d8,0);
  local_1e8 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_1e8,1);
  local_1f8 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_1f8,0);
  local_208 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_208,1);
  local_1c4 = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_220 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_220,0);
  local_230 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_230,2);
  local_240 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_240,0);
  local_250 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_250,2);
  local_20c = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_268 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_268,0);
  local_278 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_278,3);
  local_288 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_288,0);
  local_298 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_298,3);
  local_254 = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_2b0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_2b0,1);
  local_2c0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_2c0,2);
  local_2d0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_2d0,1);
  local_2e0 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_2e0,2);
  local_29c = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_2f8 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_2f8,1);
  local_308 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_308,3);
  local_318 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_318,1);
  local_328 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_328,3);
  local_2e4 = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  local_340 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_340,2);
  local_350 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_350,3);
  local_360 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_360,2);
  local_370 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                         in_stack_fffffffffffff70c);
  pstd::span<const_float>::operator[](&local_370,3);
  local_32c = DifferenceOfProducts<float,float,float,float>
                        (in_stack_fffffffffffff724,in_stack_fffffffffffff720,
                         in_stack_fffffffffffff71c,in_stack_fffffffffffff718);
  terms_3 = -local_134;
  fVar4 = local_17c;
  terms_5 = local_1c4;
  terms_1 = local_20c;
  local_374 = InnerProduct<float,float,float,float,float,float,float,float,float,float,float,float>
                        (in_stack_fffffffffffff744,in_stack_fffffffffffff740,
                         in_stack_fffffffffffff73c,in_stack_fffffffffffff738,
                         in_stack_fffffffffffff734,in_stack_fffffffffffff730,
                         in_stack_fffffffffffff72c,in_stack_fffffffffffff728,
                         in_stack_fffffffffffff750,in_stack_fffffffffffff758,
                         in_stack_fffffffffffff760,in_stack_fffffffffffff768);
  if ((local_374 != 0.0) || (NAN(local_374))) {
    fVar2 = 1.0 / local_374;
    local_378 = fVar2;
    local_3c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_3c8,1);
    local_3d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_3d8,3);
    local_3e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_3e8,2);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_3b8 = fVar2 * eVar3;
    local_3f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_3f8,1);
    local_408 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_408,2);
    local_418 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_418,3);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    local_3b4 = fVar1 * eVar3;
    fVar2 = local_378;
    local_428 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_428,1);
    local_438 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_438,3);
    local_448 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_448,2);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_3b0 = fVar2 * eVar3;
    local_458 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_458,1);
    local_468 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_468,2);
    local_478 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_478,3);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar2 = local_378;
    local_3ac = fVar1 * eVar3;
    local_488 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_488,0);
    local_498 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_498,2);
    local_4a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_4a8,3);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_3a8 = fVar2 * eVar3;
    local_4b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_4b8,0);
    local_4c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_4c8,3);
    local_4d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_4d8,2);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar2 = local_378;
    local_3a4 = fVar1 * eVar3;
    local_4e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_4e8,0);
    local_4f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_4f8,2);
    local_508 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_508,3);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_3a0 = fVar2 * eVar3;
    local_518 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_518,0);
    local_528 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_528,3);
    local_538 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_538,2);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar2 = local_378;
    local_39c = fVar1 * eVar3;
    local_548 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_548,0);
    local_558 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_558,3);
    local_568 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_568,1);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_398 = fVar2 * eVar3;
    local_578 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_578,0);
    local_588 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_588,1);
    local_598 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_598,3);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar2 = local_378;
    local_394 = fVar1 * eVar3;
    local_5a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_5a8,0);
    local_5b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_5b8,3);
    local_5c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_5c8,1);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_390 = fVar2 * eVar3;
    local_5d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_5d8,0);
    local_5e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_5e8,1);
    local_5f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_5f8,3);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar2 = local_378;
    local_38c = fVar1 * eVar3;
    local_608 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_608,0);
    local_618 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_618,1);
    local_628 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_628,2);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_388 = fVar2 * eVar3;
    local_638 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_638,0);
    local_648 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_648,2);
    local_658 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_658,1);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar2 = local_378;
    local_384 = fVar1 * eVar3;
    local_668 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_668,0);
    local_678 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_678,1);
    local_688 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_688,2);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    fVar1 = local_378;
    local_380 = fVar2 * eVar3;
    local_698 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_698,0);
    local_6a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_6a8,2);
    local_6b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
                           in_stack_fffffffffffff70c);
    pstd::span<const_float>::operator[](&local_6b8,1);
    eVar3 = InnerProduct<float,float,float,float,float,float>
                      (in_stack_fffffffffffff724,terms_1,in_stack_fffffffffffff71c,terms_3,
                       in_stack_fffffffffffff714,terms_5);
    local_37c = fVar1 * eVar3;
    SquareMatrix<4>::SquareMatrix(&local_6f8,(Float (*) [4])&local_3b8);
    pstd::optional<pbrt::SquareMatrix<4>_>::optional
              ((optional<pbrt::SquareMatrix<4>_> *)CONCAT44(in_stack_fffffffffffff714,terms_5),
               (SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffff70c,fVar4));
  }
  else {
    memset(in_RDI,0,0x44);
    pstd::optional<pbrt::SquareMatrix<4>_>::optional(in_RDI);
  }
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline pstd::optional<SquareMatrix<4>> Inverse(const SquareMatrix<4> &m) {
    // Via: https://github.com/google/ion/blob/master/ion/math/matrixutils.cc,
    // (c) Google, Apache license.

    // For 4x4 do not compute the adjugate as the transpose of the cofactor
    // matrix, because this results in extra work. Several calculations can be
    // shared across the sub-determinants.
    //
    // This approach is explained in David Eberly's Geometric Tools book,
    // excerpted here:
    //   http://www.geometrictools.com/Documentation/LaplaceExpansionTheorem.pdf
    Float s0 = DifferenceOfProducts(m[0][0], m[1][1], m[1][0], m[0][1]);
    Float s1 = DifferenceOfProducts(m[0][0], m[1][2], m[1][0], m[0][2]);
    Float s2 = DifferenceOfProducts(m[0][0], m[1][3], m[1][0], m[0][3]);

    Float s3 = DifferenceOfProducts(m[0][1], m[1][2], m[1][1], m[0][2]);
    Float s4 = DifferenceOfProducts(m[0][1], m[1][3], m[1][1], m[0][3]);
    Float s5 = DifferenceOfProducts(m[0][2], m[1][3], m[1][2], m[0][3]);

    Float c0 = DifferenceOfProducts(m[2][0], m[3][1], m[3][0], m[2][1]);
    Float c1 = DifferenceOfProducts(m[2][0], m[3][2], m[3][0], m[2][2]);
    Float c2 = DifferenceOfProducts(m[2][0], m[3][3], m[3][0], m[2][3]);

    Float c3 = DifferenceOfProducts(m[2][1], m[3][2], m[3][1], m[2][2]);
    Float c4 = DifferenceOfProducts(m[2][1], m[3][3], m[3][1], m[2][3]);
    Float c5 = DifferenceOfProducts(m[2][2], m[3][3], m[3][2], m[2][3]);

    Float determinant = InnerProduct(s0, c5, -s1, c4, s2, c3, s3, c2, s5, c0, -s4, c1);
    if (determinant == 0)
        return {};
    Float s = 1 / determinant;

    Float inv[4][4] = {s * InnerProduct(m[1][1], c5, m[1][3], c3, -m[1][2], c4),
                       s * InnerProduct(-m[0][1], c5, m[0][2], c4, -m[0][3], c3),
                       s * InnerProduct(m[3][1], s5, m[3][3], s3, -m[3][2], s4),
                       s * InnerProduct(-m[2][1], s5, m[2][2], s4, -m[2][3], s3),

                       s * InnerProduct(-m[1][0], c5, m[1][2], c2, -m[1][3], c1),
                       s * InnerProduct(m[0][0], c5, m[0][3], c1, -m[0][2], c2),
                       s * InnerProduct(-m[3][0], s5, m[3][2], s2, -m[3][3], s1),
                       s * InnerProduct(m[2][0], s5, m[2][3], s1, -m[2][2], s2),

                       s * InnerProduct(m[1][0], c4, m[1][3], c0, -m[1][1], c2),
                       s * InnerProduct(-m[0][0], c4, m[0][1], c2, -m[0][3], c0),
                       s * InnerProduct(m[3][0], s4, m[3][3], s0, -m[3][1], s2),
                       s * InnerProduct(-m[2][0], s4, m[2][1], s2, -m[2][3], s0),

                       s * InnerProduct(-m[1][0], c3, m[1][1], c1, -m[1][2], c0),
                       s * InnerProduct(m[0][0], c3, m[0][2], c0, -m[0][1], c1),
                       s * InnerProduct(-m[3][0], s3, m[3][1], s1, -m[3][2], s0),
                       s * InnerProduct(m[2][0], s3, m[2][2], s0, -m[2][1], s1)};

    return SquareMatrix<4>(inv);
}